

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetDirectoryPropertyCommand.h
# Opt level: O0

cmCommand * __thiscall cmGetDirectoryPropertyCommand::Clone(cmGetDirectoryPropertyCommand *this)

{
  cmCommand *this_00;
  cmGetDirectoryPropertyCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmGetDirectoryPropertyCommand((cmGetDirectoryPropertyCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
      return new cmGetDirectoryPropertyCommand;
    }